

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graph_impl.hpp
# Opt level: O1

vertex_iterator __thiscall
xmotion::Graph<SquareCell,_double,_xmotion::DefaultIndexer<SquareCell>_>::ObtainVertexFromVertexMap
          (Graph<SquareCell,_double,_xmotion::DefaultIndexer<SquareCell>_> *this,SquareCell state)

{
  ulong uVar1;
  _Hash_node_base *p_Var2;
  _Node_iterator_base<std::pair<const_long,_xmotion::Graph<SquareCell,_double,_xmotion::DefaultIndexer<SquareCell>_>::Vertex_*>,_false>
  _Var3;
  int64_t *piVar4;
  ulong uVar5;
  __node_base_ptr p_Var6;
  __node_base_ptr p_Var7;
  
  uVar1 = (this->vertex_map_)._M_h._M_bucket_count;
  uVar5 = (ulong)state.id % uVar1;
  p_Var6 = (this->vertex_map_)._M_h._M_buckets[uVar5];
  p_Var7 = (__node_base_ptr)0x0;
  if ((p_Var6 != (__node_base_ptr)0x0) &&
     (p_Var2 = p_Var6->_M_nxt, p_Var7 = p_Var6,
     (_Hash_node_base *)state.id != p_Var6->_M_nxt[1]._M_nxt)) {
    while (p_Var6 = p_Var2, p_Var2 = p_Var6->_M_nxt, p_Var2 != (_Hash_node_base *)0x0) {
      p_Var7 = (__node_base_ptr)0x0;
      if (((ulong)p_Var2[1]._M_nxt % uVar1 != uVar5) ||
         (p_Var7 = p_Var6, (_Hash_node_base *)state.id == p_Var2[1]._M_nxt)) goto LAB_00102ab7;
    }
    p_Var7 = (__node_base_ptr)0x0;
  }
LAB_00102ab7:
  if (p_Var7 == (__node_base_ptr)0x0) {
    _Var3._M_cur = (__node_type *)0x0;
  }
  else {
    _Var3._M_cur = (__node_type *)p_Var7->_M_nxt;
  }
  if ((_Node_iterator_base<std::pair<const_long,_xmotion::Graph<SquareCell,_double,_xmotion::DefaultIndexer<SquareCell>_>::Vertex_*>,_false>
       )_Var3._M_cur ==
      (_Node_iterator_base<std::pair<const_long,_xmotion::Graph<SquareCell,_double,_xmotion::DefaultIndexer<SquareCell>_>::Vertex_*>,_false>
       )0x0) {
    piVar4 = (int64_t *)operator_new(0x80);
    *piVar4 = state.idx.x;
    piVar4[1] = state.idx.y;
    piVar4[2] = state.id;
    piVar4[3] = state.id;
    piVar4[6] = (int64_t)(piVar4 + 5);
    piVar4[5] = (int64_t)(piVar4 + 5);
    piVar4[7] = 0;
    piVar4[9] = (int64_t)(piVar4 + 8);
    piVar4[8] = (int64_t)(piVar4 + 8);
    piVar4[10] = 0;
    *(undefined2 *)(piVar4 + 0xb) = 0;
    *(undefined4 *)(piVar4 + 0xc) = 0xffffffff;
    *(undefined4 *)((long)piVar4 + 100) = 0x7fefffff;
    *(undefined4 *)(piVar4 + 0xd) = 0xffffffff;
    *(undefined4 *)((long)piVar4 + 0x6c) = 0x7fefffff;
    piVar4[0xe] = 0x7fefffffffffffff;
    piVar4[0xf] = 0;
    std::
    _Hashtable<long,std::pair<long_const,xmotion::Graph<SquareCell,double,xmotion::DefaultIndexer<SquareCell>>::Vertex*>,std::allocator<std::pair<long_const,xmotion::Graph<SquareCell,double,xmotion::DefaultIndexer<SquareCell>>::Vertex*>>,std::__detail::_Select1st,std::equal_to<long>,std::hash<long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
    ::
    _M_emplace<std::pair<long,xmotion::Graph<SquareCell,double,xmotion::DefaultIndexer<SquareCell>>::Vertex*>>
              ((_Hashtable<long,std::pair<long_const,xmotion::Graph<SquareCell,double,xmotion::DefaultIndexer<SquareCell>>::Vertex*>,std::allocator<std::pair<long_const,xmotion::Graph<SquareCell,double,xmotion::DefaultIndexer<SquareCell>>::Vertex*>>,std::__detail::_Select1st,std::equal_to<long>,std::hash<long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                *)&this->vertex_map_);
    uVar1 = (this->vertex_map_)._M_h._M_bucket_count;
    uVar5 = (ulong)state.id % uVar1;
    p_Var6 = (this->vertex_map_)._M_h._M_buckets[uVar5];
    p_Var7 = (__node_base_ptr)0x0;
    if ((p_Var6 != (__node_base_ptr)0x0) &&
       (p_Var2 = p_Var6->_M_nxt, p_Var7 = p_Var6,
       (_Hash_node_base *)state.id != p_Var6->_M_nxt[1]._M_nxt)) {
      while (p_Var6 = p_Var2, p_Var2 = p_Var6->_M_nxt, p_Var2 != (_Hash_node_base *)0x0) {
        p_Var7 = (__node_base_ptr)0x0;
        if (((ulong)p_Var2[1]._M_nxt % uVar1 != uVar5) ||
           (p_Var7 = p_Var6, (_Hash_node_base *)state.id == p_Var2[1]._M_nxt)) goto LAB_00102ba5;
      }
      p_Var7 = (__node_base_ptr)0x0;
    }
LAB_00102ba5:
    if (p_Var7 == (__node_base_ptr)0x0) {
      _Var3._M_cur = (__node_type *)0x0;
    }
    else {
      _Var3._M_cur = (__node_type *)p_Var7->_M_nxt;
    }
  }
  return (vertex_iterator)_Var3._M_cur;
}

Assistant:

typename Graph<State, Transition, StateIndexer>::vertex_iterator
Graph<State, Transition, StateIndexer>::ObtainVertexFromVertexMap(State state) {
  int64_t state_id = GetStateIndex(state);
  auto it = vertex_map_.find(state_id);

  if (it == vertex_map_.end()) {
    auto new_vertex = new Vertex(state, state_id);
    new_vertex->search_parent = vertex_end();
    vertex_map_.insert(std::make_pair(state_id, new_vertex));
    return vertex_iterator(vertex_map_.find(state_id));
  }

  return vertex_iterator(it);
}